

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_infinity(secp256k1_ge *r)

{
  secp256k1_fe *in_RDI;
  
  *(undefined4 *)in_RDI[2].n = 1;
  secp256k1_fe_impl_set_int(in_RDI,0);
  secp256k1_fe_impl_set_int(in_RDI + 1,0);
  secp256k1_ge_verify((secp256k1_ge *)0x1115093);
  return;
}

Assistant:

static void secp256k1_ge_set_infinity(secp256k1_ge *r) {
    r->infinity = 1;
    secp256k1_fe_set_int(&r->x, 0);
    secp256k1_fe_set_int(&r->y, 0);

    SECP256K1_GE_VERIFY(r);
}